

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# balance.hpp
# Opt level: O2

void print_dynamic_assigner(Master *master,DynamicAssigner *dynamic_assigner)

{
  FILE *f;
  int iVar1;
  undefined8 in_RAX;
  int i;
  ulong uVar2;
  undefined8 local_38;
  
  local_38 = in_RAX;
  fmt::v7::print<char[18],,char>(_stderr,(char (*) [18])"DynamicAssigner: ");
  for (uVar2 = 0; f = _stderr,
      uVar2 < ((ulong)((long)(master->blocks_).elements_.
                             super__Vector_base<void_*,_std::allocator<void_*>_>._M_impl.
                             super__Vector_impl_data._M_finish -
                      (long)(master->blocks_).elements_.
                            super__Vector_base<void_*,_std::allocator<void_*>_>._M_impl.
                            super__Vector_impl_data._M_start) >> 3 & 0xffffffff); uVar2 = uVar2 + 1)
  {
    local_38._4_4_ =
         (master->gids_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
         super__Vector_impl_data._M_start[uVar2];
    iVar1 = (*(dynamic_assigner->super_Assigner)._vptr_Assigner[3])(dynamic_assigner);
    local_38 = CONCAT44(local_38._4_4_,iVar1);
    fmt::v7::print<char[24],int,int,char>
              (f,(char (*) [24])"[gid, proc] = [{}, {}] ",(int *)((long)&local_38 + 4),
               (int *)&local_38);
  }
  fmt::v7::print<char[2],,char>(_stderr,(char (*) [2])0x17ab8d);
  return;
}

Assistant:

void print_dynamic_assigner(const diy::Master&            master,
                            const diy::DynamicAssigner&   dynamic_assigner)
{
    fmt::print(stderr, "DynamicAssigner: ");
    for (auto i = 0; i < master.size(); i++)
        fmt::print(stderr, "[gid, proc] = [{}, {}] ", master.gid(i), dynamic_assigner.rank(master.gid(i)));
    fmt::print(stderr, "\n");
}